

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RDLrelation.c
# Opt level: O1

void RDL_findTransitiveClosure(RDL_URFinfo *uInfo)

{
  uint uVar1;
  uint uVar2;
  long lVar3;
  int iVar4;
  RDL_stack *stack;
  void *__s;
  void *__ptr;
  void *__ptr_00;
  void *__ptr_01;
  void *pvVar5;
  uint *puVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  long lVar10;
  ulong uVar11;
  long lVar12;
  ulong uVar13;
  uint uVar14;
  ulong uVar15;
  
  stack = RDL_stack_new();
  if (uInfo->nofWeights != 0) {
    uVar13 = 0;
    do {
      uVar7 = (ulong)uInfo->nofProtos[uVar13];
      __s = malloc(uVar7);
      memset(__s,0,uVar7);
      __ptr = malloc(uVar7 * 8);
      __ptr_00 = malloc(uVar7 << 2);
      __ptr_01 = malloc(uVar7 << 2);
      uVar7 = (ulong)uInfo->nofProtos[uVar13];
      uVar14 = 0;
      if (uInfo->nofProtos[uVar13] != 0) {
        uVar9 = 0;
        uVar8 = 0;
        uVar14 = 0;
        do {
          if (*(char *)((long)__s + uVar9) == '\0') {
            pvVar5 = malloc(uVar7 << 2);
            uVar7 = (ulong)uVar14;
            *(void **)((long)__ptr + uVar7 * 8) = pvVar5;
            *(undefined4 *)((long)__ptr_00 + uVar7 * 4) = 0;
            *(int *)((long)__ptr_01 + uVar8 * 4) = (int)uVar9;
            RDL_stack_push(stack,(void *)((long)__ptr_01 + uVar8 * 4));
            uVar8 = (ulong)((int)uVar8 + 1);
            *(undefined1 *)((long)__s + uVar9) = 1;
            while (iVar4 = RDL_stack_empty(stack), iVar4 == 0) {
              puVar6 = (uint *)RDL_stack_top(stack);
              uVar1 = *puVar6;
              RDL_stack_pop(stack);
              uVar2 = *(uint *)((long)__ptr_00 + uVar7 * 4);
              *(uint *)((long)pvVar5 + (ulong)uVar2 * 4) = uVar1;
              *(uint *)((long)__ptr_00 + uVar7 * 4) = uVar2 + 1;
              if (uInfo->nofProtos[uVar13] != 0) {
                uVar15 = 0;
                do {
                  if ((*(char *)((long)__s + uVar15) == '\0') &&
                     (uInfo->URFrel[uVar13][uVar1][uVar15] != '\0')) {
                    *(undefined1 *)((long)__s + uVar15) = 1;
                    *(int *)((long)__ptr_01 + uVar8 * 4) = (int)uVar15;
                    RDL_stack_push(stack,(void *)((long)__ptr_01 + uVar8 * 4));
                    uVar8 = (ulong)((int)uVar8 + 1);
                  }
                  uVar15 = uVar15 + 1;
                } while (uVar15 < uInfo->nofProtos[uVar13]);
              }
            }
            uVar14 = uVar14 + 1;
          }
          uVar9 = uVar9 + 1;
          uVar7 = (ulong)uInfo->nofProtos[uVar13];
        } while (uVar9 < uVar7);
      }
      if (uVar14 != 0) {
        uVar7 = 0;
        do {
          uVar9 = (ulong)*(uint *)((long)__ptr_00 + uVar7 * 4);
          if (uVar9 != 0) {
            lVar10 = 0;
            uVar8 = uVar9;
            uVar15 = 0;
            do {
              uVar11 = uVar15 + 1;
              if (uVar11 < uVar9) {
                lVar3 = *(long *)((long)__ptr + uVar7 * 8);
                lVar12 = 1;
                do {
                  uVar1 = *(uint *)(lVar3 + uVar15 * 4);
                  uVar2 = *(uint *)(lVar3 + lVar10 + lVar12 * 4);
                  uInfo->URFrel[uVar13][uVar1][uVar2] = '\x01';
                  uInfo->URFrel[uVar13][uVar2][uVar1] = '\x01';
                  lVar12 = lVar12 + 1;
                } while ((int)uVar8 != (int)lVar12);
              }
              lVar10 = lVar10 + 4;
              uVar8 = uVar8 - 1;
              uVar15 = uVar11;
            } while (uVar11 != uVar9);
          }
          uVar7 = uVar7 + 1;
        } while (uVar7 != uVar14);
        uVar7 = 0;
        do {
          free(*(void **)((long)__ptr + uVar7 * 8));
          uVar7 = uVar7 + 1;
        } while (uVar14 != uVar7);
      }
      free(__ptr);
      free(__ptr_00);
      free(__s);
      free(__ptr_01);
      uVar13 = uVar13 + 1;
    } while (uVar13 < uInfo->nofWeights);
  }
  RDL_stack_delete(stack);
  return;
}

Assistant:

void RDL_findTransitiveClosure(RDL_URFinfo *uInfo)
{
  unsigned i,j,k,l;
  RDL_stack* dfs_stack;
  char* visited;
  unsigned cc_id;
  unsigned **cc;
  unsigned *cc_size;
  unsigned u, v;
  unsigned *elements;
  unsigned next_free_element;
  unsigned *curr_elem;

  dfs_stack = RDL_stack_new();

  for(i = 0; i < uInfo->nofWeights; ++i) {
    visited = malloc(uInfo->nofProtos[i] * sizeof(*visited));
    memset(visited, 0, uInfo->nofProtos[i] * sizeof(*visited));

    cc_id = 0;
    cc = malloc(uInfo->nofProtos[i] * sizeof(*cc));
    cc_size = malloc(uInfo->nofProtos[i] * sizeof(*cc_size));
    elements = malloc(uInfo->nofProtos[i] * sizeof(*elements));
    next_free_element = 0;

    /*
     * perform a DFS search on the URF relations
     * and collect the connected components
     */
    for(j = 0; j < uInfo->nofProtos[i]; ++j) {
      if (!visited[j]) {
        cc[cc_id] = malloc(uInfo->nofProtos[i] * sizeof(**cc));
        cc_size[cc_id] = 0;

        elements[next_free_element] = j;
        RDL_stack_push(dfs_stack, &(elements[next_free_element]));
        ++next_free_element;
        visited[j] = 1;
        while (!RDL_stack_empty(dfs_stack)) {
          curr_elem = RDL_stack_top(dfs_stack);
          k = *curr_elem;
          RDL_stack_pop(dfs_stack);

          /* save the connected components */
          cc[cc_id][cc_size[cc_id]] = k;
          ++cc_size[cc_id];

          for (l = 0; l < uInfo->nofProtos[i]; ++l) {
            if (!visited[l] && uInfo->URFrel[i][k][l]) {
              visited[l] = 1;
              elements[next_free_element] = l;
              RDL_stack_push(dfs_stack, &(elements[next_free_element]));
              ++next_free_element;
            }
          }
        }

        ++cc_id;
      }
    }

    /* every pair inside a CC is URF related */
    for(j = 0; j < cc_id; ++j) {
      for (k = 0; k < cc_size[j]; ++k) {
        for (l = k+1; l < cc_size[j]; ++l) {
          u = cc[j][k];
          v = cc[j][l];
          uInfo->URFrel[i][u][v] = 1;
          uInfo->URFrel[i][v][u] = 1;
        }
      }
    }

    for(j = 0; j < cc_id; ++j) {
      free(cc[j]);
    }
    free(cc);
    free(cc_size);
    free(visited);
    free(elements);
  }

  RDL_stack_delete(dfs_stack);
}